

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test::
TestBody(BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test *this)

{
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substring;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  undefined8 *puVar1;
  char *pcVar2;
  AssertionResult AVar3;
  _Any_data __tmp;
  Response metrics;
  AssertHelper local_d8;
  undefined8 *local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [16];
  _Any_data local_a8;
  long local_98 [2];
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70 [2];
  _Any_data *local_60;
  _Any_data local_50;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  uStack_c0 = 0;
  uStack_bc = 0;
  local_88._M_unused._0_8_ =
       (undefined8)
       *(undefined8 *)
        &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
         super__Function_base._M_functor;
  local_88._8_8_ =
       *(undefined8 *)
        ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
                super__Function_base._M_functor + 8);
  *(BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test **)
   &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
    super__Function_base._M_functor = this;
  *(undefined4 *)
   ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
           super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)
   ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
           super__Function_base._M_functor + 0xc) = 0;
  local_78 = (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
             super__Function_base._M_manager;
  (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.super__Function_base
  ._M_manager = std::
                _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:227:22)>
                ::_M_manager;
  local_70[0] = (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
                _M_invoker;
  (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_._M_invoker =
       std::
       _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:227:22)>
       ::_M_invoke;
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  IntegrationTest::FetchMetrics
            ((Response *)&local_88,(IntegrationTest *)this,
             &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.default_metrics_path_);
  local_a8._0_4_ = 200;
  AVar3 = testing::internal::CmpHelperEQ<long,int>
                    ((internal *)&local_c8,"metrics.code","200",(long *)local_88._M_pod_data,
                     (int *)local_a8._M_pod_data);
  substring._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )AVar3.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  if (local_c8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)CONCAT44(uStack_bc,uStack_c0) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(uStack_bc,uStack_c0);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((long *)local_a8._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_a8._M_unused._M_object + 8))();
    }
    puVar1 = (undefined8 *)CONCAT44(uStack_bc,uStack_c0);
  }
  else {
    puVar1 = (undefined8 *)CONCAT44(uStack_bc,uStack_c0);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
      substring._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    testing::HasSubstr<std::__cxx11::string>
              (&local_38,(testing *)&(this->super_BasicAuthIntegrationTest).counter_name_,
               (StringLike<std::__cxx11::basic_string<char>_> *)
               substring._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    local_c8._M_head_impl = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_38.impl_.substring_._M_dataplus._M_p,
               local_38.impl_.substring_._M_dataplus._M_p +
               local_38.impl_.substring_._M_string_length);
    local_a8._M_unused._M_object = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_c8._M_head_impl,
               local_c8._M_head_impl + CONCAT44(uStack_bc,uStack_c0));
    if (local_c8._M_head_impl != local_b8) {
      operator_delete(local_c8._M_head_impl);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
    ::operator()(&local_d8,local_a8._M_pod_data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1664e8);
    if ((long *)local_a8._M_unused._0_8_ != local_98) {
      operator_delete(local_a8._M_unused._M_object);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.impl_.substring_._M_dataplus._M_p != &local_38.impl_.substring_.field_2) {
      operator_delete(local_38.impl_.substring_._M_dataplus._M_p);
    }
    puVar1 = local_d0;
    if ((char)local_d8.data_ == '\0') {
      testing::Message::Message((Message *)&local_c8);
      if (local_d0 == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (char *)*local_d0;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                 ,0xeb,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      puVar1 = local_d0;
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
        puVar1 = local_d0;
      }
    }
  }
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if ((_Invoker_type *)local_88._8_8_ != local_70) {
    operator_delete((void *)local_88._8_8_);
  }
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldPerformProperAuthentication) {
  fetchPrePerform_ = [&](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(curl, CURLOPT_USERNAME, username_.c_str());
    curl_easy_setopt(curl, CURLOPT_PASSWORD, password_.c_str());
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.body, HasSubstr(counter_name_));
}